

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O2

float gimage::anon_unknown_11::negLog(float *p)

{
  float fVar1;
  float fVar2;
  
  fVar2 = logf(*p);
  fVar1 = *p;
  *p = -fVar2;
  return fVar1 * -fVar2;
}

Assistant:

inline float negLog(float &p)
{
  double v=-std::log(p);
  float ret=static_cast<float>(p*v);

  p=static_cast<float>(v);

  return ret;
}